

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O2

void __thiscall
helics::ValueFederate::ValueFederate(ValueFederate *this,void **vtt,char *configString)

{
  char *in_RCX;
  size_t extraout_RDX;
  string *in_R8;
  string_view fedName;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  local_30 = local_20;
  local_28 = 0;
  local_20[0] = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_50,configString,&local_51);
  fedName._M_str = in_RCX;
  fedName._M_len = extraout_RDX;
  ValueFederate(this,vtt,fedName,in_R8);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

ValueFederate::ValueFederate(const char* configString):
    ValueFederate(std::string{}, std::string{configString})
{
}